

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void OpenSteer::drawXZCheckerboardGrid
               (float size,int subsquares,Vec3 *center,Color *color1,Color *color2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Color *d;
  Color *in_R9;
  float fVar4;
  float local_ac;
  Vec3 local_a8;
  int local_98;
  uint local_94;
  uint local_90;
  float local_8c;
  float local_88;
  Vec3 local_78;
  Vec3 local_68;
  Vec3 local_58;
  undefined1 local_48 [24];
  
  local_88 = size / (float)subsquares;
  (*glad_glPushAttrib)(0x2000);
  (*glad_glDisable)(0xb44);
  uVar2 = 0;
  local_94 = 0;
  if (0 < subsquares) {
    local_94 = subsquares;
  }
  local_48._0_16_ = ZEXT416((uint)local_88);
  local_ac = size * -0.5;
  local_98 = subsquares;
  while (fVar4 = size * -0.5, iVar3 = local_98, uVar1 = uVar2, uVar2 != local_94) {
    while (local_90 = uVar1, iVar3 != 0) {
      local_a8.x = local_ac;
      local_a8.y = 0.0;
      local_a8.z = fVar4;
      local_8c = fVar4;
      Vec3::operator+=(&local_a8,center);
      fVar4 = (float)local_48._4_4_ + local_a8.y;
      local_58.z = local_a8.z + 0.0;
      local_58.y = fVar4;
      local_58.x = (float)local_48._0_4_ + local_a8.x;
      local_78.z = local_a8.z + local_88;
      local_68.y = fVar4;
      local_68.x = (float)local_48._0_4_ + local_a8.x;
      local_78.y = fVar4;
      local_78.x = local_a8.x + 0.0;
      d = color2;
      if ((uVar2 & 1) != 0) {
        d = color1;
      }
      local_68.z = local_78.z;
      anon_unknown.dwarf_1ac78::iDrawQuadrangle
                ((anon_unknown_dwarf_1ac78 *)&local_a8,&local_58,&local_68,&local_78,(Vec3 *)d,in_R9
                );
      uVar2 = (uint)(byte)((byte)uVar2 ^ 1);
      fVar4 = local_8c + local_88;
      iVar3 = iVar3 + -1;
      uVar1 = local_90;
    }
    local_ac = local_ac + local_88;
    uVar2 = local_90 + 1;
  }
  (*glad_glPopAttrib)();
  return;
}

Assistant:

void 
OpenSteer::drawXZCheckerboardGrid (const float size,
                                   const int subsquares,
                                   const Vec3& center,
                                   const Color& color1,
                                   const Color& color2)
{
    const float half = size/2;
    const float spacing = size / subsquares;

    beginDoubleSidedDrawing ();
    {
        bool flag1 = false;
        float p = -half;
        Vec3 corner;
        for (int i = 0; i < subsquares; i++)
        {
            bool flag2 = flag1;
            float q = -half;
            for (int j = 0; j < subsquares; j++)
            {
                corner.set (p, 0, q);
                corner += center;
                iDrawQuadrangle (corner,
                                 corner + Vec3 (spacing, 0,       0),
                                 corner + Vec3 (spacing, 0, spacing),
                                 corner + Vec3 (0,       0, spacing),
                                 flag2 ? color1 : color2);
                flag2 = !flag2;
                q += spacing;
            }
            flag1 = !flag1;
            p += spacing;
        }
    }
    endDoubleSidedDrawing ();
}